

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
psy::C::Lexer::lexIntegerOrFloating_AtFollowOfSuffix
          (Lexer *this,SyntaxToken *tk,function<void_()> *makeLexeme)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = this->yychar_;
  iVar2 = isalnum((uint)bVar1);
  if ((bVar1 != 0x5f) && (iVar2 == 0)) {
    if ((makeLexeme->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*makeLexeme->_M_invoker)((_Any_data *)makeLexeme);
      return;
    }
    std::__throw_bad_function_call();
  }
  tk->syntaxK_ = Error;
  do {
    do {
      yyinput(this);
      bVar1 = this->yychar_;
      iVar2 = isalnum((uint)bVar1);
    } while (bVar1 == 0x5f);
  } while (iVar2 != 0);
  return;
}

Assistant:

void Lexer::lexIntegerOrFloating_AtFollowOfSuffix(SyntaxToken* tk,
                                                  std::function<void ()> makeLexeme)
{
    if (std::isalnum(yychar_) || yychar_ == '_') {
        tk->syntaxK_ = SyntaxKind::Error;
        do {
            yyinput();
        }
        while (std::isalnum(yychar_) || yychar_ == '_');
        return;
    }

    makeLexeme();
}